

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.hh
# Opt level: O0

void __thiscall Pl_RC4::~Pl_RC4(Pl_RC4 *this)

{
  uchar *in_RCX;
  size_t in_RDX;
  RC4_KEY *in_RSI;
  uchar *in_R8;
  Pl_RC4 *this_local;
  
  RC4::~RC4(&this->rc4,in_RSI,in_RDX,in_RCX,in_R8);
  std::shared_ptr<unsigned_char>::~shared_ptr(&this->outbuf);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_RC4() final = default;